

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_GammaCorrection(GammaCorrectionForm1 GammaCorrection)

{
  byte value;
  bool bVar1;
  uint uVar2;
  uint8_t value_00;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  Image output;
  Image input;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_40,value,0,0,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  uVar2 = rand();
  dVar3 = (double)(uVar2 % 100) / 100.0;
  uVar2 = rand();
  dVar5 = (double)(uVar2 % 300) / 100.0;
  (*GammaCorrection)(&local_68,&local_40,dVar3,dVar5);
  dVar5 = pow((double)value / 255.0,dVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar5 * dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,ZEXT816(0x406fe00000000000),ZEXT816(0x3fe0000000000000));
  value_00 = 0xff;
  if (auVar4._0_8_ < 256.0) {
    value_00 = (uint8_t)(int)auVar4._0_8_;
  }
  bVar1 = Unit_Test::verifyImage(&local_68,value_00);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  return bVar1;
}

Assistant:

bool form1_GammaCorrection(GammaCorrectionForm1 GammaCorrection)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const double a     = randomValue <uint32_t>( 100 ) / 100.0;
        const double gamma = randomValue <uint32_t>( 300 ) / 100.0;

        const PenguinV_Image::Image output = GammaCorrection( input, a, gamma );

        const double value = a * pow( intensity / 255.0, gamma ) * 255 + 0.5;
        const uint8_t corrected = (value < 256) ? static_cast<uint8_t>(value) : 255;

        return verifyImage( output, corrected );
    }